

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double eval_guided_crit<float,long,long_double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,long *Xc_ind,
                 long *Xc_indptr,double *buffer_arr,size_t *buffer_pos,bool as_relative_gain,
                 double *saved_xmedian,double *split_point,double *xmin,double *xmax,
                 GainCriterion criterion,double min_gain,MissingAction missing_action,
                 size_t *cols_use,size_t ncols_use,bool force_cols_use,double *X_row_major,
                 size_t ncols,double *Xr,size_t *Xr_ind,size_t *Xr_indptr)

{
  size_t *__first;
  double *pdVar1;
  ulong uVar2;
  size_t sVar3;
  ulong *puVar4;
  ulong *puVar5;
  double *pdVar6;
  ulong end_00;
  size_t *psVar7;
  long lVar8;
  ulong uVar9;
  MissingAction missing_action_00;
  bool bVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  size_t ignored;
  
  missing_action_00 = missing_action;
  __first = buffer_pos;
  todense<float,long>(ix_arr,st,end,col_num,Xc,Xc_ind,Xc_indptr,buffer_arr);
  auVar14 = _DAT_0036b1f0;
  end_00 = end - st;
  uVar9 = end_00 + 1;
  if (uVar9 != 0) {
    uVar2 = end_00 & 0x1fffffffffffffff;
    auVar12._8_4_ = (int)uVar2;
    auVar12._0_8_ = uVar2;
    auVar12._12_4_ = (int)(uVar2 >> 0x20);
    sVar3 = 0;
    auVar12 = auVar12 ^ _DAT_0036b1f0;
    auVar17 = _DAT_0036b1e0;
    do {
      auVar16 = auVar17 ^ auVar14;
      if ((bool)(~(auVar16._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar16._0_4_ ||
                  auVar12._4_4_ < auVar16._4_4_) & 1)) {
        __first[sVar3] = sVar3;
      }
      if ((auVar16._12_4_ != auVar12._12_4_ || auVar16._8_4_ <= auVar12._8_4_) &&
          auVar16._12_4_ <= auVar12._12_4_) {
        __first[sVar3 + 1] = sVar3 + 1;
      }
      sVar3 = sVar3 + 2;
      lVar8 = auVar17._8_8_;
      auVar17._0_8_ = auVar17._0_8_ + 2;
      auVar17._8_8_ = lVar8 + 2;
    } while ((uVar2 - ((uint)end_00 & 1)) + 2 != sVar3);
  }
  if (missing_action_00 == Impute) {
    missing_action_00 = Fail;
    bVar10 = uVar9 != 0;
    if (bVar10) {
      if ((ulong)ABS(*buffer_arr) < 0x7ff0000000000000) {
        uVar2 = 0;
        do {
          if (end_00 == uVar2) goto LAB_002c8ff0;
          lVar8 = uVar2 + 1;
          uVar2 = uVar2 + 1;
        } while ((ulong)ABS(buffer_arr[lVar8]) < 0x7ff0000000000000);
        bVar10 = uVar2 < uVar9;
      }
      if (bVar10) {
        uVar2 = uVar9 * 4 & 0xfffffffffffffff8;
        lVar8 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar8 == 0; lVar8 = lVar8 + -1) {
          }
        }
        std::
        __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<eval_guided_crit<float,long,long_double>(unsigned_long*,unsigned_long,unsigned_long,unsigned_long,float*,long*,long*,double*,unsigned_long*,bool,double*,double&,double&,double&,GainCriterion,double,MissingAction,unsigned_long*,unsigned_long,bool,double*,unsigned_long,double*,unsigned_long*,unsigned_long*)::_lambda(unsigned_long,unsigned_long)_1_>>
                  (__first,(unsigned_long *)((long)__first + uVar2),__first + uVar9,
                   (ulong)(((uint)lVar8 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_crit_hpp:3440:30)>
                    )&buffer_arr);
        dVar11 = buffer_arr[*(long *)((long)__first + uVar2)];
        *saved_xmedian = dVar11;
        if ((end_00 & 1) != 0) {
          puVar5 = __first;
          if (uVar2 != 8) {
            lVar8 = uVar2 - 8;
            psVar7 = __first;
            puVar4 = __first;
            do {
              puVar4 = puVar4 + 1;
              puVar5 = puVar4;
              if (*puVar4 <= *psVar7) {
                puVar5 = psVar7;
              }
              lVar8 = lVar8 + -8;
              psVar7 = puVar5;
            } while (lVar8 != 0);
          }
          auVar14._0_8_ = (double)CONCAT44(0x43300000,(int)*puVar5);
          auVar14._8_4_ = (int)(*puVar5 >> 0x20);
          auVar14._12_4_ = 0x45300000;
          dVar15 = (auVar14._8_8_ - 1.9342813113834067e+25) + (auVar14._0_8_ - 4503599627370496.0);
          *saved_xmedian = (dVar11 - dVar15) * 0.5 + dVar15;
        }
        lVar8 = uVar9 + (uVar9 == 0);
        pdVar1 = buffer_arr;
        do {
          pdVar6 = saved_xmedian;
          if ((ulong)ABS(*pdVar1) < 0x7ff0000000000000) {
            pdVar6 = pdVar1;
          }
          *pdVar1 = *pdVar6;
          auVar14 = _DAT_0036b1f0;
          pdVar1 = pdVar1 + 1;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
        if (uVar9 != 0) {
          uVar2 = end_00 & 0x1fffffffffffffff;
          auVar13._8_4_ = (int)uVar2;
          auVar13._0_8_ = uVar2;
          auVar13._12_4_ = (int)(uVar2 >> 0x20);
          sVar3 = 0;
          auVar13 = auVar13 ^ _DAT_0036b1f0;
          auVar16 = _DAT_0036b1e0;
          do {
            auVar17 = auVar16 ^ auVar14;
            if ((bool)(~(auVar17._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar17._0_4_ ||
                        auVar13._4_4_ < auVar17._4_4_) & 1)) {
              __first[sVar3] = sVar3;
            }
            if ((auVar17._12_4_ != auVar13._12_4_ || auVar17._8_4_ <= auVar13._8_4_) &&
                auVar17._12_4_ <= auVar13._12_4_) {
              __first[sVar3 + 1] = sVar3 + 1;
            }
            sVar3 = sVar3 + 2;
            lVar8 = auVar16._8_8_;
            auVar16._0_8_ = auVar16._0_8_ + 2;
            auVar16._8_8_ = lVar8 + 2;
            missing_action_00 = Fail;
          } while ((uVar2 - ((uint)end_00 & 1)) + 2 != sVar3);
        }
      }
      else {
LAB_002c8ff0:
        missing_action_00 = Fail;
      }
    }
  }
  dVar11 = eval_guided_crit<double,long_double>
                     (__first,0,end_00,buffer_arr,buffer_arr + uVar9,as_relative_gain,saved_xmedian,
                      (double *)0x0,&ignored,split_point,xmin,xmax,criterion,min_gain,
                      missing_action_00,cols_use,ncols_use,force_cols_use,X_row_major,ncols,Xr,
                      Xr_ind,Xr_indptr);
  return dVar11;
}

Assistant:

double eval_guided_crit(size_t ix_arr[], size_t st, size_t end,
                        size_t col_num, real_t_ Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                        double buffer_arr[], size_t buffer_pos[], bool as_relative_gain,
                        double *restrict saved_xmedian,
                        double &split_point, double &xmin, double &xmax,
                        GainCriterion criterion, double min_gain, MissingAction missing_action,
                        size_t *restrict cols_use, size_t ncols_use, bool force_cols_use,
                        double *restrict X_row_major, size_t ncols,
                        double *restrict Xr, size_t *restrict Xr_ind, size_t *restrict Xr_indptr)
{
    size_t ignored;


    todense(ix_arr, st, end,
            col_num, Xc, Xc_ind, Xc_indptr,
            buffer_arr);
    size_t tot = end - st + 1;
    std::iota(buffer_pos, buffer_pos + tot, (size_t)0);

    if (missing_action == Impute)
    {
        missing_action = Fail;
        for (size_t ix = 0; ix < tot; ix++)
        {
            if (unlikely(is_na_or_inf(buffer_arr[ix])))
            {
                goto fill_missing;
            }
        }
        goto no_nas;

        fill_missing:
        {
            size_t idx_half = div2(tot);
            std::nth_element(buffer_pos, buffer_pos + idx_half, buffer_pos + tot,
                             [&buffer_arr](const size_t a, const size_t b){return buffer_arr[a] < buffer_arr[b];});
            *saved_xmedian = buffer_arr[buffer_pos[idx_half]];

            if ((tot % 2) == 0)
            {
                double xlow = *std::max_element(buffer_pos, buffer_pos + idx_half);
                *saved_xmedian = xlow + ((*saved_xmedian)-xlow)/2.;
            }

            for (size_t ix = 0; ix < tot; ix++)
                buffer_arr[ix] = is_na_or_inf(buffer_arr[ix])? (*saved_xmedian) : buffer_arr[ix];
            std::iota(buffer_pos, buffer_pos + tot, (size_t)0);
        }
    }

    no_nas:
    return eval_guided_crit<double, ldouble_safe>(
                            buffer_pos, 0, end - st, buffer_arr, buffer_arr + tot,
                            as_relative_gain, saved_xmedian, (double*)NULL, ignored, split_point,
                            xmin, xmax, criterion, min_gain, missing_action,
                            cols_use, ncols_use, force_cols_use,
                            X_row_major, ncols,
                            Xr, Xr_ind, Xr_indptr);
}